

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# region.c
# Opt level: O0

char ** Qiniu_Region_Get_Io_Preferred_Hosts(Qiniu_Region *region,size_t *count)

{
  size_t *count_local;
  Qiniu_Region *region_local;
  
  if (count != (size_t *)0x0) {
    *count = 0;
  }
  if (region == (Qiniu_Region *)0x0) {
    region_local = (Qiniu_Region *)0x0;
  }
  else if (region->ioService == (_Qiniu_Region_Service *)0x0) {
    region_local = (Qiniu_Region *)0x0;
  }
  else if ((region->ioService->hosts == (char **)0x0) ||
          (region->ioService->preferredHostsCount == 0)) {
    region_local = (Qiniu_Region *)0x0;
  }
  else {
    if (count != (size_t *)0x0) {
      *count = region->ioService->preferredHostsCount;
    }
    region_local = (Qiniu_Region *)
                   (region->ioService->hosts + region->ioService->acceleratedHostsCount);
  }
  return &region_local->regionId;
}

Assistant:

const char *const *Qiniu_Region_Get_Io_Preferred_Hosts(Qiniu_Region *region, size_t *count)
{
    if (count != NULL)
    {
        *count = 0;
    }
    if (region == NULL)
    {
        return NULL;
    }
    if (region->ioService == NULL)
    {
        return NULL;
    }
    if (region->ioService->hosts == NULL || region->ioService->preferredHostsCount == 0)
    {
        return NULL;
    }
    if (count != NULL)
    {
        *count = region->ioService->preferredHostsCount;
    }
    return region->ioService->hosts + region->ioService->acceleratedHostsCount;
}